

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnNeutralize
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view building,
          TeamType *oldTeam)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  string msg;
  long *local_60;
  long local_58;
  long local_50 [2];
  code *local_40;
  Server *local_38;
  
  if ((*(uint *)&this->field_0xa0 >> 0x1d & 1) == 0) {
    local_40 = RenX::Server::sendAdmChan;
  }
  else {
    local_40 = RenX::Server::sendLogChan;
  }
  local_60 = local_50;
  pcVar1 = (this->neutralizeFmt)._M_dataplus._M_p;
  local_38 = server;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->neutralizeFmt)._M_string_length);
  if (local_58 != 0) {
    RenX::processTags((string *)&local_60,local_38,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14f0);
    auVar4 = RenX::translateName(building._M_len,building._M_str);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar4 = RenX::getTeamColor(*oldTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar4 = RenX::getTeamName(*oldTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar4 = RenX::getFullTeamName(*oldTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    (*local_40)(local_38,local_58,local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnNeutralize(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view building, const RenX::TeamType &oldTeam)
{
	logFuncType func;
	if (RenX_LoggingPlugin::neutralizePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->neutralizeFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(building));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(oldTeam));
		(server.*func)(msg);
	}
}